

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositeATN.hpp
# Opt level: O1

void __thiscall
Centaurus::CATNDeparture<unsigned_char>::CATNDeparture
          (CATNDeparture<unsigned_char> *this,CharClass<unsigned_char> *label,ATNPath *path,
          int color,PriorityChain *priority)

{
  (this->m_label)._vptr_CharClass = (_func_int **)&PTR__CharClass_001a14d0;
  std::vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>::
  vector(&(this->m_label).m_ranges,&label->m_ranges);
  std::
  vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
  ::vector(&(this->m_path).
            super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
           ,&path->
             super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
          );
  (this->m_path)._vptr_ATNPath = (_func_int **)&PTR__ATNPath_001a1a38;
  this->m_color = color;
  std::vector<Centaurus::PriorityChainElement,_std::allocator<Centaurus::PriorityChainElement>_>::
  vector(&(this->m_priority).
          super_vector<Centaurus::PriorityChainElement,_std::allocator<Centaurus::PriorityChainElement>_>
         ,&priority->
           super_vector<Centaurus::PriorityChainElement,_std::allocator<Centaurus::PriorityChainElement>_>
        );
  return;
}

Assistant:

CATNDeparture(const CharClass<TCHAR>& label, const ATNPath& path, int color, const PriorityChain& priority)
        : m_label(label), m_path(path), m_color(color), m_priority(priority)
    {
    }